

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O0

void expand_vec_mul(TCGContext_conflict9 *tcg_ctx,TCGType_conflict type,uint vece,TCGv_vec v0,
                   TCGv_vec v1,TCGv_vec v2)

{
  TCGv_vec pTVar1;
  TCGv_vec pTVar2;
  TCGv_vec v;
  TCGv_vec r;
  TCGArg TVar3;
  TCGArg TVar4;
  TCGArg TVar5;
  TCGv_vec t4;
  TCGv_vec t3;
  TCGv_vec t2;
  TCGv_vec t1;
  TCGv_vec v2_local;
  TCGv_vec v1_local;
  TCGv_vec v0_local;
  uint vece_local;
  TCGType_conflict type_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  if (type == TCG_TYPE_V64) {
    pTVar1 = tcg_temp_new_vec_tricore(tcg_ctx,TCG_TYPE_V128);
    pTVar2 = tcg_temp_new_vec_tricore(tcg_ctx,TCG_TYPE_V128);
    tcg_gen_dup16i_vec_tricore(tcg_ctx,pTVar2,0);
    TVar3 = tcgv_vec_arg(tcg_ctx,pTVar1);
    TVar4 = tcgv_vec_arg(tcg_ctx,v1);
    TVar5 = tcgv_vec_arg(tcg_ctx,pTVar2);
    vec_gen_3_tricore(tcg_ctx,INDEX_op_x86_punpckl_vec,TCG_TYPE_V128,0,TVar3,TVar4,TVar5);
    TVar3 = tcgv_vec_arg(tcg_ctx,pTVar2);
    TVar4 = tcgv_vec_arg(tcg_ctx,pTVar2);
    TVar5 = tcgv_vec_arg(tcg_ctx,v2);
    vec_gen_3_tricore(tcg_ctx,INDEX_op_x86_punpckl_vec,TCG_TYPE_V128,0,TVar3,TVar4,TVar5);
    tcg_gen_mul_vec_tricore(tcg_ctx,1,pTVar1,pTVar1,pTVar2);
    tcg_gen_shri_vec_tricore(tcg_ctx,1,pTVar1,pTVar1,8);
    TVar3 = tcgv_vec_arg(tcg_ctx,v0);
    TVar4 = tcgv_vec_arg(tcg_ctx,pTVar1);
    TVar5 = tcgv_vec_arg(tcg_ctx,pTVar1);
    vec_gen_3_tricore(tcg_ctx,INDEX_op_x86_packus_vec,TCG_TYPE_V128,0,TVar3,TVar4,TVar5);
    tcg_temp_free_vec(tcg_ctx,pTVar1);
    tcg_temp_free_vec(tcg_ctx,pTVar2);
  }
  else {
    if (1 < type - TCG_TYPE_V128) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
                 ,0xd7e,(char *)0x0);
    }
    pTVar1 = tcg_temp_new_vec_tricore(tcg_ctx,type);
    pTVar2 = tcg_temp_new_vec_tricore(tcg_ctx,type);
    v = tcg_temp_new_vec_tricore(tcg_ctx,type);
    r = tcg_temp_new_vec_tricore(tcg_ctx,type);
    tcg_gen_dup16i_vec_tricore(tcg_ctx,r,0);
    TVar3 = tcgv_vec_arg(tcg_ctx,pTVar1);
    TVar4 = tcgv_vec_arg(tcg_ctx,v1);
    TVar5 = tcgv_vec_arg(tcg_ctx,r);
    vec_gen_3_tricore(tcg_ctx,INDEX_op_x86_punpckl_vec,type,0,TVar3,TVar4,TVar5);
    TVar3 = tcgv_vec_arg(tcg_ctx,pTVar2);
    TVar4 = tcgv_vec_arg(tcg_ctx,r);
    TVar5 = tcgv_vec_arg(tcg_ctx,v2);
    vec_gen_3_tricore(tcg_ctx,INDEX_op_x86_punpckl_vec,type,0,TVar3,TVar4,TVar5);
    TVar3 = tcgv_vec_arg(tcg_ctx,v);
    TVar4 = tcgv_vec_arg(tcg_ctx,v1);
    TVar5 = tcgv_vec_arg(tcg_ctx,r);
    vec_gen_3_tricore(tcg_ctx,INDEX_op_x86_punpckh_vec,type,0,TVar3,TVar4,TVar5);
    TVar3 = tcgv_vec_arg(tcg_ctx,r);
    TVar4 = tcgv_vec_arg(tcg_ctx,r);
    TVar5 = tcgv_vec_arg(tcg_ctx,v2);
    vec_gen_3_tricore(tcg_ctx,INDEX_op_x86_punpckh_vec,type,0,TVar3,TVar4,TVar5);
    tcg_gen_mul_vec_tricore(tcg_ctx,1,pTVar1,pTVar1,pTVar2);
    tcg_gen_mul_vec_tricore(tcg_ctx,1,v,v,r);
    tcg_gen_shri_vec_tricore(tcg_ctx,1,pTVar1,pTVar1,8);
    tcg_gen_shri_vec_tricore(tcg_ctx,1,v,v,8);
    TVar3 = tcgv_vec_arg(tcg_ctx,v0);
    TVar4 = tcgv_vec_arg(tcg_ctx,pTVar1);
    TVar5 = tcgv_vec_arg(tcg_ctx,v);
    vec_gen_3_tricore(tcg_ctx,INDEX_op_x86_packus_vec,type,0,TVar3,TVar4,TVar5);
    tcg_temp_free_vec(tcg_ctx,pTVar1);
    tcg_temp_free_vec(tcg_ctx,pTVar2);
    tcg_temp_free_vec(tcg_ctx,v);
    tcg_temp_free_vec(tcg_ctx,r);
  }
  return;
}

Assistant:

static void expand_vec_mul(TCGContext *tcg_ctx, TCGType type, unsigned vece,
                           TCGv_vec v0, TCGv_vec v1, TCGv_vec v2)
{
    TCGv_vec t1, t2, t3, t4;

    tcg_debug_assert(vece == MO_8);

    /*
     * Unpack v1 bytes to words, 0 | x.
     * Unpack v2 bytes to words, y | 0.
     * This leaves the 8-bit result, x * y, with 8 bits of right padding.
     * Shift logical right by 8 bits to clear the high 8 bytes before
     * using an unsigned saturated pack.
     *
     * The difference between the V64, V128 and V256 cases is merely how
     * we distribute the expansion between temporaries.
     */
    switch (type) {
    case TCG_TYPE_V64:
        t1 = tcg_temp_new_vec(tcg_ctx, TCG_TYPE_V128);
        t2 = tcg_temp_new_vec(tcg_ctx, TCG_TYPE_V128);
        tcg_gen_dup16i_vec(tcg_ctx, t2, 0);
        vec_gen_3(tcg_ctx, INDEX_op_x86_punpckl_vec, TCG_TYPE_V128, MO_8,
                  tcgv_vec_arg(tcg_ctx, t1), tcgv_vec_arg(tcg_ctx, v1), tcgv_vec_arg(tcg_ctx, t2));
        vec_gen_3(tcg_ctx, INDEX_op_x86_punpckl_vec, TCG_TYPE_V128, MO_8,
                  tcgv_vec_arg(tcg_ctx, t2), tcgv_vec_arg(tcg_ctx, t2), tcgv_vec_arg(tcg_ctx, v2));
        tcg_gen_mul_vec(tcg_ctx, MO_16, t1, t1, t2);
        tcg_gen_shri_vec(tcg_ctx, MO_16, t1, t1, 8);
        vec_gen_3(tcg_ctx, INDEX_op_x86_packus_vec, TCG_TYPE_V128, MO_8,
                  tcgv_vec_arg(tcg_ctx, v0), tcgv_vec_arg(tcg_ctx, t1), tcgv_vec_arg(tcg_ctx, t1));
        tcg_temp_free_vec(tcg_ctx, t1);
        tcg_temp_free_vec(tcg_ctx, t2);
        break;

    case TCG_TYPE_V128:
    case TCG_TYPE_V256:
        t1 = tcg_temp_new_vec(tcg_ctx, type);
        t2 = tcg_temp_new_vec(tcg_ctx, type);
        t3 = tcg_temp_new_vec(tcg_ctx, type);
        t4 = tcg_temp_new_vec(tcg_ctx, type);
        tcg_gen_dup16i_vec(tcg_ctx, t4, 0);
        vec_gen_3(tcg_ctx, INDEX_op_x86_punpckl_vec, type, MO_8,
                  tcgv_vec_arg(tcg_ctx, t1), tcgv_vec_arg(tcg_ctx, v1), tcgv_vec_arg(tcg_ctx, t4));
        vec_gen_3(tcg_ctx, INDEX_op_x86_punpckl_vec, type, MO_8,
                  tcgv_vec_arg(tcg_ctx, t2), tcgv_vec_arg(tcg_ctx, t4), tcgv_vec_arg(tcg_ctx, v2));
        vec_gen_3(tcg_ctx, INDEX_op_x86_punpckh_vec, type, MO_8,
                  tcgv_vec_arg(tcg_ctx, t3), tcgv_vec_arg(tcg_ctx, v1), tcgv_vec_arg(tcg_ctx, t4));
        vec_gen_3(tcg_ctx, INDEX_op_x86_punpckh_vec, type, MO_8,
                  tcgv_vec_arg(tcg_ctx, t4), tcgv_vec_arg(tcg_ctx, t4), tcgv_vec_arg(tcg_ctx, v2));
        tcg_gen_mul_vec(tcg_ctx, MO_16, t1, t1, t2);
        tcg_gen_mul_vec(tcg_ctx, MO_16, t3, t3, t4);
        tcg_gen_shri_vec(tcg_ctx, MO_16, t1, t1, 8);
        tcg_gen_shri_vec(tcg_ctx, MO_16, t3, t3, 8);
        vec_gen_3(tcg_ctx, INDEX_op_x86_packus_vec, type, MO_8,
                  tcgv_vec_arg(tcg_ctx, v0), tcgv_vec_arg(tcg_ctx, t1), tcgv_vec_arg(tcg_ctx, t3));
        tcg_temp_free_vec(tcg_ctx, t1);
        tcg_temp_free_vec(tcg_ctx, t2);
        tcg_temp_free_vec(tcg_ctx, t3);
        tcg_temp_free_vec(tcg_ctx, t4);
        break;

    default:
        g_assert_not_reached();
    }
}